

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_function_helper.cpp
# Opt level: O1

void Image_Function_Helper::Accumulate
               (AccumulateForm2 accumulate,Image *image,
               vector<unsigned_int,_std::allocator<unsigned_int>_> *result)

{
  Image_Function::ParameterValidation<PenguinV_Image::ImageTemplate<unsigned_char>>(image);
  (*accumulate)(image,0,0,image->_width,image->_height,result);
  return;
}

Assistant:

void Accumulate( FunctionTable::AccumulateForm2 accumulate,
                     const Image & image, std::vector < uint32_t > & result )
    {
        Image_Function::ParameterValidation( image );

        accumulate( image, 0, 0, image.width(), image.height(), result );
    }